

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_gather_offsets
               (NegativeTestContext *ctx)

{
  DataType DVar1;
  int iVar2;
  bool *pbVar3;
  bool bVar4;
  bool bVar5;
  ContextType CVar6;
  char *pcVar7;
  long *plVar8;
  size_t sVar9;
  ostream *poVar10;
  NotSupportedError *this;
  ShaderType SVar11;
  size_type *psVar12;
  long lVar13;
  _Alloc_hider _Var14;
  int iVar15;
  string shaderSource;
  ostringstream source;
  undefined1 auStack_4d8 [8];
  NegativeTestContext *local_4d0;
  int *local_4c8;
  ShaderType local_4bc;
  size_type *local_4b8;
  ostream *local_4b0;
  string local_4a8;
  string local_488;
  char *local_468;
  long local_460;
  undefined4 local_458;
  undefined4 uStack_454;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  long *local_3c8;
  long local_3c0;
  long local_3b8 [2];
  long *local_3a8;
  long local_3a0;
  long local_398 [2];
  string local_388;
  string local_368;
  long local_348;
  string local_340;
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  local_4d0 = ctx;
  CVar6.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(CVar6,(ApiType)0x23);
  bVar5 = true;
  if (!bVar4) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"GL_EXT_gpu_shader5","");
    bVar5 = NegativeTestContext::isExtensionSupported(local_4d0,&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar5 == false) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"This test requires a context version 3.2 or higher.",
               "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(\"GL_EXT_gpu_shader5\")"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeShaderFunctionTests.cpp"
               ,0x10c3);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_320._0_8_ = local_320 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"textureGatherOffsets","");
  NegativeTestContext::beginSection(local_4d0,(string *)local_320);
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  lVar13 = 0;
  do {
    SVar11 = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar13];
    bVar5 = NegativeTestContext::isShaderSupported(local_4d0,SVar11);
    if (bVar5) {
      local_4bc = SVar11;
      local_348 = lVar13;
      pcVar7 = glu::getShaderTypeName(SVar11);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,pcVar7,(allocator<char> *)&local_408);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,0x1cbc003);
      psVar12 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar12) {
        local_320._16_8_ = *psVar12;
        local_320._24_8_ = plVar8[3];
        local_320._0_8_ = local_320 + 0x10;
      }
      else {
        local_320._16_8_ = *psVar12;
        local_320._0_8_ = (size_type *)*plVar8;
      }
      local_320._8_8_ = plVar8[1];
      *plVar8 = (long)psVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      NegativeTestContext::beginSection(local_4d0,(string *)local_320);
      if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
        operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
      }
      if ((_func_int **)local_1a8._0_8_ != local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
      }
      local_4b8 = (size_type *)0x0;
      do {
        SVar11 = (ShaderType)psVar12;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        CVar6.super_ApiType.m_bits = (ApiType)(*local_4d0->m_renderCtx->_vptr_RenderContext[2])();
        bVar5 = glu::contextSupports(CVar6,(ApiType)0x23);
        pcVar7 = glu::getGLSLVersionDeclaration(bVar5 | GLSL_VERSION_310_ES);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)auStack_4d8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x330);
        }
        else {
          sVar9 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        NegativeTestShared::(anonymous_namespace)::getShaderInitialization_abi_cxx11_
                  (&local_408,(_anonymous_namespace_ *)local_4d0,
                   (NegativeTestContext *)(ulong)local_4bc,SVar11);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_408._M_dataplus._M_p,
                             local_408._M_string_length);
        local_4c8 = (int *)(&DAT_01cbca70 + (long)local_4b8 * 0x1c);
        local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
        local_428.field_2._M_allocated_capacity._0_4_ = 0x706d6173;
        local_428._M_string_length = 7;
        local_428.field_2._M_allocated_capacity._4_4_ = 0x72656c;
        declareShaderUniform
                  (&local_368,*(DataType *)(&UNK_01cbca74 + (long)local_4b8 * 0x1c),&local_428);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_368._M_dataplus._M_p,local_368._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"void main(void)\n",0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{\n",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\tmediump ",9);
        local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
        local_448.field_2._M_allocated_capacity._0_2_ = 0x50;
        local_448._M_string_length = 1;
        declareAndInitializeShaderVariable(&local_388,local_4c8[2],&local_448);
        local_4b0 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_388._M_dataplus._M_p,local_388._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(local_4b0,"    mediump ",0xc);
        bVar5 = (char)local_4c8[5] != '\0';
        pbVar3 = glcts::fixed_sample_locations_values;
        if (bVar5) {
          pbVar3 = (bool *)"\tconst ";
        }
        lVar13 = 0;
        if (bVar5) {
          lVar13 = 6;
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_4b0,pbVar3 + 1,lVar13);
        DVar1 = local_4c8[3];
        iVar2 = local_4c8[6];
        local_468 = (char *)&local_458;
        local_458 = 0x7366666f;
        local_460 = 7;
        uStack_454 = 0x737465;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        pcVar7 = glu::getDataTypeName(DVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)auStack_4d8 + (int)*(undefined8 *)(local_320._0_8_ + -0x18) + 0x1b8);
        }
        else {
          sVar9 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," ",1);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_320,local_468,local_460);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[",1);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
        pcVar7 = glu::getDataTypeName(DVar1);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
        }
        else {
          sVar9 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar7,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"[](",3);
        if (0 < iVar2) {
          iVar15 = 0;
          do {
            pcVar7 = glu::getDataTypeName(DVar1);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)auStack_4d8 + (int)*(undefined8 *)(local_320._0_8_ + -0x18) +
                              0x1b8);
            }
            else {
              sVar9 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,pcVar7,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"(",1);
            poVar10 = (ostream *)std::ostream::operator<<(local_320,0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
            poVar10 = (ostream *)std::ostream::operator<<(poVar10,0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            pbVar3 = glcts::fixed_sample_locations_values;
            if (iVar15 < iVar2 + -1) {
              pbVar3 = (bool *)" , ";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,pbVar3 + 1,(ulong)((uint)(iVar15 < iVar2 + -1) * 2));
            iVar15 = iVar15 + 1;
          } while (iVar2 != iVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,");",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_4b0,(char *)local_3a8,local_3a0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if (local_3a8 != local_398) {
          operator_delete(local_3a8,local_398[0] + 1);
        }
        if (local_468 != (char *)&local_458) {
          operator_delete(local_468,CONCAT44(uStack_454,local_458) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p != &local_448.field_2) {
          operator_delete(local_448._M_dataplus._M_p,
                          CONCAT62(local_448.field_2._M_allocated_capacity._2_6_,
                                   local_448.field_2._M_allocated_capacity._0_2_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_368._M_dataplus._M_p != &local_368.field_2) {
          operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_428._M_dataplus._M_p != &local_428.field_2) {
          operator_delete(local_428._M_dataplus._M_p,
                          CONCAT44(local_428.field_2._M_allocated_capacity._4_4_,
                                   local_428.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_408._M_dataplus._M_p != &local_408.field_2) {
          operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
        }
        if (*local_4c8 == 0) {
          DVar1 = local_4c8[4];
          if (DVar1 == TYPE_LAST) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"\ttextureGatherOffsets(sampler, P, offsets);\n",0x2c);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tmediump ",9);
            local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
            local_488.field_2._M_allocated_capacity._0_4_ = 0x706d6f63;
            local_488._M_string_length = 4;
            local_488.field_2._M_allocated_capacity._4_4_ =
                 local_488.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
            declareAndInitializeShaderVariable((string *)local_320,DVar1,&local_488);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\ttextureGatherOffsets(sampler, P, offsets, comp);\n",0x32);
            if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
              operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_488._M_dataplus._M_p != &local_488.field_2) {
              lVar13 = CONCAT44(local_488.field_2._M_allocated_capacity._4_4_,
                                local_488.field_2._M_allocated_capacity._0_4_);
              _Var14._M_p = local_488._M_dataplus._M_p;
              goto LAB_01636be8;
            }
          }
        }
        else if (*local_4c8 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\tmediump ",9);
          local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
          local_4a8.field_2._M_allocated_capacity._0_4_ = 0x5a666572;
          local_4a8._M_string_length = 4;
          local_4a8.field_2._M_allocated_capacity._4_4_ =
               local_4a8.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
          declareAndInitializeShaderVariable((string *)local_320,local_4c8[4],&local_4a8);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\ttextureGatherOffsets(sampler, P, refZ, offsets);\n",0x32);
          if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
            operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
            lVar13 = CONCAT44(local_4a8.field_2._M_allocated_capacity._4_4_,
                              local_4a8.field_2._M_allocated_capacity._0_4_);
            _Var14._M_p = local_4a8._M_dataplus._M_p;
LAB_01636be8:
            operator_delete(_Var14._M_p,lVar13 + 1);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e8,local_3c8,local_3c0 + (long)local_3c8);
        verifyShader(local_4d0,local_4bc,&local_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
        }
        if (local_3c8 != local_3b8) {
          operator_delete(local_3c8,local_3b8[0] + 1);
        }
        psVar12 = (size_type *)((long)local_4b8 + 1);
        local_4b8 = psVar12;
      } while (psVar12 != (size_type *)0x1c);
      NegativeTestContext::endSection(local_4d0);
      lVar13 = local_348;
    }
    lVar13 = lVar13 + 1;
    if (lVar13 == 6) {
      NegativeTestContext::endSection(local_4d0);
      return;
    }
  } while( true );
}

Assistant:

void texture_gather_offsets (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError,
		contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported("GL_EXT_gpu_shader5"),
		"This test requires a context version 3.2 or higher.");

	const struct TextureGatherOffsetsTestSpec testSpecs[] =
	{
			//mode										samplerDataType						pDataType				offsetsDataType			fourthArgument		offsetIsConst	offsetArraySize
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D,				glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_LAST,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_COMP,	glu::TYPE_SAMPLER_2D_ARRAY,			glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_SHADOW,		glu::TYPE_FLOAT_VEC2,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},

		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	false,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			3,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT,		glu::TYPE_INT_VEC2,		glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT,			glu::TYPE_FLOAT,	true,			4,		},
		{	FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z,	glu::TYPE_SAMPLER_2D_ARRAY_SHADOW,	glu::TYPE_FLOAT_VEC3,	glu::TYPE_INT_VEC2,		glu::TYPE_INT,		true,			4,		},
	};

	ctx.beginSection("textureGatherOffsets");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int specNdx = 0; specNdx < DE_LENGTH_OF_ARRAY(testSpecs); ++specNdx)
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffsets(ctx, s_shaders[shaderNdx], testSpecs[specNdx]));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}